

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

void __thiscall
smf::MidiMessage::makeMts2_KeyTuningsByFrequency
          (MidiMessage *this,int key,double frequency,int program)

{
  pair<int,_double> pVar1;
  value_type local_50;
  undefined1 local_40 [8];
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> mapping;
  double dStack_20;
  int program_local;
  double frequency_local;
  MidiMessage *pMStack_10;
  int key_local;
  MidiMessage *this_local;
  
  mapping.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = program;
  dStack_20 = frequency;
  frequency_local._4_4_ = key;
  pMStack_10 = this;
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
            ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)local_40);
  pVar1 = std::make_pair<int&,double&>((int *)((long)&frequency_local + 4),&stack0xffffffffffffffe0)
  ;
  local_50.second = pVar1.second;
  local_50.first = pVar1.first;
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::push_back
            ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)local_40,
             &local_50);
  makeMts2_KeyTuningsByFrequency
            (this,(vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  local_40,
             mapping.
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~vector
            ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)local_40);
  return;
}

Assistant:

void MidiMessage::makeMts2_KeyTuningsByFrequency(int key, double frequency, int program) {
	std::vector<std::pair<int, double>> mapping;
	mapping.push_back(std::make_pair(key, frequency));
	this->makeMts2_KeyTuningsByFrequency(mapping, program);
}